

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

string * __thiscall
t_js_generator::ts_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,
          bool include_callback)

{
  t_struct *ptVar1;
  pointer pcVar2;
  t_field *ptVar3;
  pointer pptVar4;
  undefined1 *puVar5;
  string *psVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  t_type *ptVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  size_type *psVar11;
  ulong *puVar12;
  pointer pptVar13;
  ulong uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string exception_types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  string *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  t_function *local_a0;
  t_struct *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_98 = (t_struct *)
             CONCAT44(local_98._4_4_,(int)CONCAT71(in_register_00000009,include_callback));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar1 = tfunction->arglist_;
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_b0 = __return_storage_ptr__;
  local_a0 = tfunction;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  local_a8 = &__return_storage_ptr__->field_2;
  std::__cxx11::string::operator=((string *)local_b0,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  pptVar13 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar13 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar3 = *pptVar13;
      ts_get_req_abi_cxx11_(&local_90,this,*pptVar13);
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)(ptVar3->name_)._M_dataplus._M_p);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
      puVar12 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar12) {
        local_e0 = *puVar12;
        lStack_d8 = plVar9[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar12;
        local_f0 = (ulong *)*plVar9;
      }
      local_e8 = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ts_get_type_abi_cxx11_(&local_70,this,(*pptVar13)->type_);
      uVar14 = 0xf;
      if (local_f0 != &local_e0) {
        uVar14 = local_e0;
      }
      if (uVar14 < local_70._M_string_length + local_e8) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar15 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_70._M_string_length + local_e8) goto LAB_0029f01d;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f0);
      }
      else {
LAB_0029f01d:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70._M_dataplus._M_p)
        ;
      }
      puVar12 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_110.field_2._M_allocated_capacity = *puVar12;
        local_110.field_2._8_8_ = puVar8[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar12;
        local_110._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_110._M_string_length = puVar8[1];
      *puVar8 = puVar12;
      puVar8[1] = 0;
      *(undefined1 *)puVar12 = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_110._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pptVar13 = pptVar13 + 1;
      pptVar4 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if ((pptVar13 != pptVar4) ||
         (((char)local_98 != '\0' &&
          (pptVar4 !=
           (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_start)))) {
        std::__cxx11::string::append((char *)local_b0);
      }
    } while (pptVar13 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  paVar17 = &local_110.field_2;
  if ((char)local_98 == '\0') {
    if (this->gen_es6_ == true) {
      ts_get_type_abi_cxx11_(&local_d0,this,local_a0->returntype_);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x39b140);
      local_f0 = &local_e0;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar12) {
        local_e0 = *puVar12;
        lStack_d8 = plVar9[3];
      }
      else {
        local_e0 = *puVar12;
        local_f0 = (ulong *)*plVar9;
      }
      local_e8 = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_110.field_2._M_allocated_capacity = *psVar11;
        local_110.field_2._8_8_ = plVar9[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar11;
        local_110._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_110._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_110._M_dataplus._M_p);
    }
    else {
      ts_get_type_abi_cxx11_(&local_d0,this,local_a0->returntype_);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x39b106);
      local_f0 = &local_e0;
      puVar12 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar12) {
        local_e0 = *puVar12;
        lStack_d8 = puVar8[3];
      }
      else {
        local_e0 = *puVar12;
        local_f0 = (ulong *)*puVar8;
      }
      local_e8 = puVar8[1];
      *puVar8 = puVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_110.field_2._M_allocated_capacity = *psVar11;
        local_110.field_2._8_8_ = puVar8[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar11;
        local_110._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_110._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_110._M_dataplus._M_p);
    }
    goto LAB_0029f862;
  }
  if (this->gen_node_ == true) {
    local_98 = local_a0->xceptions_;
    local_110._M_string_length = 0;
    local_110.field_2._M_allocated_capacity =
         local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_110._M_dataplus._M_p = (pointer)paVar17;
    if ((local_98 != (t_struct *)0x0) &&
       (pptVar13 = (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
       pptVar13 !=
       (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      paVar17 = &local_d0.field_2;
      do {
        ptVar10 = t_type::get_true_type((*pptVar13)->type_);
        if (pptVar13 ==
            (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          js_type_namespace_abi_cxx11_(&local_d0,this,ptVar10->program_);
          iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])(ptVar10);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d0,*(ulong *)CONCAT44(extraout_var,iVar7));
          puVar12 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar12) {
            local_e0 = *puVar12;
            lStack_d8 = puVar8[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0 = *puVar12;
            local_f0 = (ulong *)*puVar8;
          }
          local_e8 = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
          if (local_f0 != &local_e0) {
            operator_delete(local_f0);
          }
          _Var16._M_p = local_d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar17) goto LAB_0029f356;
        }
        else {
          js_type_namespace_abi_cxx11_(&local_90,this,ptVar10->program_);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x39f1a2);
          psVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0.field_2._8_8_ = puVar8[3];
            local_d0._M_dataplus._M_p = (pointer)paVar17;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = psVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])(ptVar10);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d0,*(ulong *)CONCAT44(extraout_var_00,iVar7));
          puVar12 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar12) {
            local_e0 = *puVar12;
            lStack_d8 = puVar8[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0 = *puVar12;
            local_f0 = (ulong *)*puVar8;
          }
          local_e8 = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
          if (local_f0 != &local_e0) {
            operator_delete(local_f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar17) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          _Var16._M_p = local_90._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_0029f356:
            operator_delete(_Var16._M_p);
          }
        }
        pptVar13 = pptVar13 + 1;
      } while (pptVar13 !=
               (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_110);
    if (iVar7 == 0) {
      ts_get_type_abi_cxx11_(&local_90,this,local_a0->returntype_);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x39b0db);
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = puVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      puVar12 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar12) {
        local_e0 = *puVar12;
        lStack_d8 = puVar8[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar12;
        local_f0 = (ulong *)*puVar8;
      }
      local_e8 = puVar8[1];
      *puVar8 = puVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      psVar6 = &local_90;
    }
    else {
      std::operator+(&local_70,"callback?: (error: ",&local_110);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      paVar17 = &local_90.field_2;
      puVar12 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_90.field_2._M_allocated_capacity = *puVar12;
        local_90.field_2._8_8_ = puVar8[3];
        local_90._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_90.field_2._M_allocated_capacity = *puVar12;
        local_90._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_90._M_string_length = puVar8[1];
      *puVar8 = puVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      ts_get_type_abi_cxx11_(&local_50,this,local_a0->returntype_);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar17) {
        uVar15 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_50._M_string_length + local_90._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          uVar15 = local_50.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_50._M_string_length + local_90._M_string_length)
        goto LAB_0029f9a5;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_50,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
      }
      else {
LAB_0029f9a5:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p)
        ;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)psVar11 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      puVar12 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar12) {
        local_e0 = *puVar12;
        lStack_d8 = puVar8[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar12;
        local_f0 = (ulong *)*puVar8;
      }
      local_e8 = puVar8[1];
      *puVar8 = puVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar17) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      psVar6 = &local_70;
    }
    puVar5 = (undefined1 *)(&(psVar6->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5 != &psVar6->field_2) {
      operator_delete(puVar5);
    }
    _Var16._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_0029f724:
      operator_delete(_Var16._M_p);
    }
  }
  else {
    ts_get_type_abi_cxx11_(&local_d0,this,local_a0->returntype_);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x39b11e);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_e0 = *puVar12;
      lStack_d8 = plVar9[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar12;
      local_f0 = (ulong *)*plVar9;
    }
    local_e8 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    puVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_110.field_2._M_allocated_capacity = *puVar12;
      local_110.field_2._8_8_ = puVar8[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar12;
      local_110._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_110._M_string_length = puVar8[1];
    *puVar8 = puVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_110._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    _Var16._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_0029f724;
  }
  if (this->gen_jquery_ != true) {
    std::__cxx11::string::append((char *)local_b0);
    return local_b0;
  }
  ts_get_type_abi_cxx11_(&local_d0,this,local_a0->returntype_);
  puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x39b131);
  local_f0 = &local_e0;
  puVar12 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar12) {
    local_e0 = *puVar12;
    lStack_d8 = puVar8[3];
  }
  else {
    local_e0 = *puVar12;
    local_f0 = (ulong *)*puVar8;
  }
  local_e8 = puVar8[1];
  *puVar8 = puVar12;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_110.field_2._M_allocated_capacity = *psVar11;
    local_110.field_2._8_8_ = puVar8[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar11;
    local_110._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_110._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_110._M_dataplus._M_p);
LAB_0029f862:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return local_b0;
}

Assistant:

std::string t_js_generator::ts_function_signature(t_function* tfunction, bool include_callback) {
  string str;
  const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  str = tfunction->get_name() + "(";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    str += (*f_iter)->get_name() + ts_get_req(*f_iter) + ": " + ts_get_type((*f_iter)->get_type());

    if (f_iter + 1 != fields.end() || (include_callback && fields.size() > 0)) {
      str += ", ";
    }
  }

  if (include_callback) {
    if (gen_node_) {
      t_struct* exceptions = tfunction->get_xceptions();
      string exception_types;
      if (exceptions) {
        const vector<t_field*>& members = exceptions->get_members();
        for (vector<t_field*>::const_iterator it = members.begin(); it != members.end(); ++it) {
          t_type* t = get_true_type((*it)->get_type());
          if (it == members.begin()) {
            exception_types = js_type_namespace(t->get_program()) + t->get_name();
          } else {
            exception_types += " | " + js_type_namespace(t->get_program()) + t->get_name();
          }
        }
      }
      if (exception_types == "") {
        str += "callback?: (error: void, response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      } else {
        str += "callback?: (error: " + exception_types + ", response: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
      }
    } else {
      str += "callback?: (data: " + ts_get_type(tfunction->get_returntype()) + ")=>void): ";
    }

    if (gen_jquery_) {
      str += "JQueryPromise<" + ts_get_type(tfunction->get_returntype()) +">;";
    } else {
      str += "void;";
    }
  } else {
    if (gen_es6_) {
      str += "): Promise<" + ts_get_type(tfunction->get_returntype()) + ">;";
    }
    else {
      str += "): " + ts_get_type(tfunction->get_returntype()) + ";";
    }
  }

  return str;
}